

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O3

void __thiscall Liby::PollerPoll::removeChanel(PollerPoll *this,Channel *ch)

{
  int iVar1;
  Logger *this_00;
  double __x;
  
  if ((ch != (Channel *)0x0) && (-1 < ch->fd_)) {
    this_00 = Logger::getLogger();
    Logger::log(this_00,__x);
    iVar1 = ch->fd_;
    (this->super_Poller).channels_.
    super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
    super__Vector_impl_data._M_start[iVar1] = (Channel *)0x0;
    (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start[iVar1].fd = -1;
    return;
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp"
                ,0x34,"virtual void Liby::PollerPoll::removeChanel(Channel *)");
}

Assistant:

void PollerPoll::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);
    info("remove Channel %p", ch);
    int fd = ch->get_fd();
    setChannel(fd, nullptr);
    pollfds_[fd].fd = -1;
}